

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.c
# Opt level: O0

void lws_seq_destroy_all_on_pt(lws_context_per_thread *pt)

{
  lws_seq_t *local_28;
  lws_seq_t *s;
  lws_dll2 *tp;
  lws_dll2 *p;
  lws_context_per_thread *pt_local;
  
  tp = (pt->seq_owner).head;
  p = (lws_dll2 *)pt;
  while (tp != (lws_dll2 *)0x0) {
    s = (lws_seq_t *)tp->next;
    local_28 = (lws_seq_t *)tp;
    lws_seq_destroy(&local_28);
    tp = &s->seq_list;
  }
  return;
}

Assistant:

void
lws_seq_destroy_all_on_pt(struct lws_context_per_thread *pt)
{
	lws_start_foreach_dll_safe(struct lws_dll2 *, p, tp,
				   pt->seq_owner.head) {
		lws_seq_t *s = lws_container_of(p, lws_seq_t,
						      seq_list);

		lws_seq_destroy(&s);

	} lws_end_foreach_dll_safe(p, tp);
}